

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O2

void get_qual_hostname(char *buf,int len,attr_list attrs,int *network_p,CMTransport_trace trace_func
                      ,void *trace_data)

{
  addrinfo *paVar1;
  uint *__cp;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  void *pvVar7;
  hostent *phVar8;
  int *piVar9;
  size_t sVar10;
  long lVar11;
  addrinfo **__pai;
  char **ppcVar12;
  undefined4 in_register_00000034;
  undefined8 uVar13;
  in_addr *in;
  char *network_string;
  char *local_488;
  undefined8 local_480;
  char *local_478;
  addrinfo *info;
  addrinfo local_468;
  char hostname [1024];
  
  uVar13 = CONCAT44(in_register_00000034,len);
  pcVar4 = getenv("ADIOS2_NETWORK");
  network_string = pcVar4;
  pcVar5 = getenv("ADIOS2_HOSTNAME");
  if (pcVar5 != (char *)0x0) {
    strncpy(buf,pcVar5,0xff);
    return;
  }
  gethostname(buf,0xff);
  buf[0xfe] = '\0';
  sVar6 = strlen(buf);
  pvVar7 = memchr(buf,0x2e,sVar6);
  local_488 = pcVar4;
  if (pvVar7 == (void *)0x0) {
    buf[(int)sVar6] = '.';
    iVar2 = getdomainname(buf + (int)sVar6 + 1,(long)(0xfe00000000 - (sVar6 << 0x20)) >> 0x20);
    lVar11 = (long)((sVar6 << 0x20) + 0x100000000) >> 0x20;
    if (iVar2 == -1) {
      buf[lVar11] = '\0';
    }
    if (buf[lVar11] == '\0') {
      phVar8 = gethostbyname(buf);
      buf[(int)sVar6] = '\0';
      if (phVar8 != (hostent *)0x0) {
        strncpy(buf,phVar8->h_name,0xff);
      }
    }
    buf[0xfe] = '\0';
  }
  (*(code *)attrs)(network_p,"CM<IP_CONFIG> - Tentative Qualified hostname %s",buf);
  sVar6 = strlen(buf);
  pvVar7 = memchr(buf,0x2e,sVar6);
  if (pvVar7 == (void *)0x0) {
    hostname[0x3ff] = '\0';
    gethostname(hostname,0x3ff);
    local_468.ai_addrlen = 0;
    local_468._20_4_ = 0;
    local_468.ai_addr = (sockaddr *)0x0;
    local_468.ai_canonname = (char *)0x0;
    local_468.ai_next = (addrinfo *)0x0;
    local_468.ai_socktype = 1;
    local_468.ai_protocol = 0;
    local_468.ai_flags = 2;
    local_468.ai_family = 0;
    __pai = (addrinfo **)&info;
    iVar2 = getaddrinfo(hostname,(char *)0x0,&local_468,__pai);
    __stream = _stderr;
    if (iVar2 != 0) {
      pcVar4 = gai_strerror(iVar2);
      fprintf(__stream,"getaddrinfo: %s\n",pcVar4);
    }
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      strcpy(buf,paVar1->ai_canonname);
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)info);
  }
  if (*buf == '\0') {
LAB_0010457d:
    iVar2 = get_string_attr(uVar13,CM_IP_INTERFACE,hostname);
    if (iVar2 == 0) {
      uVar3 = get_self_ip_addr((CMTransport_trace)attrs,network_p);
    }
    else {
      uVar3 = get_self_ip_iface((CMTransport_trace)attrs,network_p,
                                (char *)CONCAT44(hostname._4_4_,hostname._0_4_));
    }
    local_468.ai_flags =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    (*(code *)attrs)(network_p,"CM<IP_CONFIG> - No hostname yet, trying gethostbyaddr on IP %lx");
    if ((((uVar3 & 0xffff0000) != 0xb6100000) && ((uVar3 & 0xffff0000) != 0xc0a80000)) &&
       ((uVar3 & 0xff000000) != 0xa000000)) {
      phVar8 = gethostbyaddr(&local_468,4,2);
      if (phVar8 == (hostent *)0x0) {
        piVar9 = __h_errno_location();
        (*(code *)attrs)(network_p,"     FAILED, errno %d",*piVar9);
      }
      else {
        (*(code *)attrs)(network_p,"     result was %s",phVar8->h_name);
        strncpy(buf,phVar8->h_name,0xff);
      }
    }
  }
  else {
    phVar8 = gethostbyname(buf);
    if (phVar8 == (hostent *)0x0) {
LAB_0010457a:
      *buf = '\0';
      goto LAB_0010457d;
    }
    iVar2 = 0;
    local_480 = uVar13;
    local_478 = buf;
    for (ppcVar12 = phVar8->h_addr_list; __cp = (uint *)*ppcVar12, __cp != (uint *)0x0;
        ppcVar12 = ppcVar12 + 1) {
      if ((char)*__cp != '\x7f') {
        iVar2 = iVar2 + 1;
        inet_ntop(2,__cp,hostname,0x10);
        uVar3 = *__cp;
        (*(code *)attrs)(network_p,"CM<IP_CONFIG> - Hostname gets good addr %lx, %s",
                         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                         uVar3 << 0x18,hostname);
      }
    }
    buf = local_478;
    uVar13 = local_480;
    if (iVar2 == 0) goto LAB_0010457a;
    if (*local_478 == '\0') goto LAB_0010457d;
  }
  pcVar4 = local_488;
  if (local_488 == (char *)0x0) {
    if (get_qual_hostname::CM_NETWORK_POSTFIX == -1) {
      get_qual_hostname::CM_NETWORK_POSTFIX = attr_atom_from_string("ADIOS2_NETWORK_POSTFIX");
    }
    iVar2 = get_string_attr(uVar13,get_qual_hostname::CM_NETWORK_POSTFIX,&network_string);
    if (iVar2 == 0) {
      (*(code *)attrs)(network_p,"TCP/IP transport found no NETWORK POSTFIX attribute");
    }
    else {
      (*(code *)attrs)(network_p,"TCP/IP transport found NETWORK POSTFIX attribute %s",
                       network_string);
    }
    pcVar4 = network_string;
    if (network_string != (char *)0x0) goto LAB_001046a8;
  }
  else {
LAB_001046a8:
    sVar6 = strlen(buf);
    sVar10 = strlen(pcVar4);
    pcVar4 = (char *)calloc(1,sVar6 + sVar10 + 2);
    pcVar5 = strchr(buf,0x2e);
    *pcVar5 = '\0';
    sprintf(pcVar4,"%s%s.%s",buf,network_string,pcVar5 + 1);
    phVar8 = gethostbyname(pcVar4);
    if (phVar8 != (hostent *)0x0) {
      strcpy(buf,pcVar4);
    }
    free(pcVar4);
  }
  if ((*buf != '\0') && (phVar8 = gethostbyname(buf), phVar8 != (hostent *)0x0)) {
    sVar6 = strlen(buf);
    pvVar7 = memchr(buf,0x2e,sVar6);
    if (pvVar7 != (void *)0x0) goto LAB_001047c2;
  }
  iVar2 = get_self_ip_addr((CMTransport_trace)attrs,network_p);
  if (iVar2 == 0) {
    if (get_qual_hostname_warn_once == '\0') {
      get_qual_hostname_warn_once = '\x01';
      (*(code *)attrs)(network_p,
                       "Attempts to establish your fully qualified hostname, or indeed any\nuseful network name, have failed horribly.  using localhost.\n"
                      );
    }
    strncpy(buf,"localhost",0xff);
  }
  else {
    uVar3 = get_self_ip_addr((CMTransport_trace)attrs,network_p);
    hostname._0_4_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
    ;
    pcVar4 = inet_ntop(2,hostname,buf,0xff);
    if (pcVar4 == (char *)0x0) {
      (*(code *)attrs)(network_p,"inet_ntop failed\n");
    }
  }
LAB_001047c2:
  (*(code *)attrs)(network_p,"CM<IP_CONFIG> - GetQualHostname returning %s",buf);
  return;
}

Assistant:

static void
get_qual_hostname(char *buf, int len, attr_list attrs,
		  int *network_p, CMTransport_trace trace_func, void *trace_data)
{
    struct hostent *host = NULL;

    char *network_string = getenv(IPCONFIG_ENVVAR_PREFIX "NETWORK");
    char *hostname_string = getenv(IPCONFIG_ENVVAR_PREFIX "HOSTNAME");
    if (hostname_string != NULL) {
	strncpy(buf, hostname_string, len);
	return;
    }
    (void)get_qual_hostname;
    gethostname(buf, len);
    buf[len - 1] = '\0';
    if (memchr(buf, '.', strlen(buf)) == NULL) {
	/* no dots, probably not fully qualified */
#ifdef HAVE_GETDOMAINNAME
	int end = strlen(buf);
	buf[end] = '.';
	if (getdomainname((&buf[end]) + 1, len - end - 1) == -1) {
	    buf[end+1]=0;
	}
	if (buf[end + 1] == 0) {
	    char *tmp_name;
	    struct hostent *host = gethostbyname(buf);
	    buf[end] = 0;
	    /* getdomainname was useless, hope that gethostbyname helps */
	    if (host) {
		tmp_name = host->h_name;
		strncpy(buf, tmp_name, len);
	    }		
	}
#else
	{
	    /* no getdomainname, hope that gethostbyname will help */
	    struct hostent *he = gethostbyname(buf);
	    char *tmp_name;
	    if (he) {
		tmp_name = (gethostbyname(buf))->h_name;
		strncpy(buf, tmp_name, len);
	    }
	}
#endif
	buf[len - 1] = '\0';
    }
    trace_func(trace_data, "CM<IP_CONFIG> - Tentative Qualified hostname %s", buf);
    if (memchr(buf, '.', strlen(buf)) == NULL) {
	/* useless hostname if it's not fully qualified */
	struct addrinfo hints, *info, *p;
	int gai_result;

	char hostname[1024];
	hostname[1023] = '\0';
	gethostname(hostname, 1023);

	memset(&hints, 0, sizeof hints);
	hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_CANONNAME;

	if ((gai_result = getaddrinfo(hostname, NULL, &hints, &info)) != 0) {
	    fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(gai_result));
	}

	for(p = info; p != NULL; p = p->ai_next) {
	    strcpy(buf, p->ai_canonname);
	}

	freeaddrinfo(info);
    }
    if ((buf[0] != 0) && ((host = gethostbyname(buf)) == NULL)) {
	/* useless hostname if we can't translate it */
	buf[0] = 0;
    }
    if (host != NULL) {
	char **p;
	int good_addr = 0;
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
		good_addr++;
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Hostname gets good addr %lx, %s",
			   ntohl(in->s_addr), str);
	    }
	}
	if (good_addr == 0) {
	    /* 
	     * even a fully qualifiedhostname that doesn't get us a valid
	     * IP addr is useless
	     */
	    buf[0] = 0;
	}
    }
    if (buf[0] == 0) {
	/* bloody hell, what do you have to do? */
	struct in_addr IP;
	extern int h_errno;
	char *iface;
	if (get_string_attr(attrs, CM_IP_INTERFACE, &iface)){
	    IP.s_addr = htonl(get_self_ip_iface(trace_func, trace_data, iface));
	} else {
	    IP.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	}
	trace_func(trace_data, "CM<IP_CONFIG> - No hostname yet, trying gethostbyaddr on IP %lx", IP);
	if (!is_private_IP(ntohl(IP.s_addr))) {
	    host = gethostbyaddr((char *) &IP, sizeof(IP), AF_INET);
	    if (host != NULL) {
		trace_func(trace_data, "     result was %s", host->h_name);
		strncpy(buf, host->h_name, len);
	    } else {
		trace_func(trace_data, "     FAILED, errno %d", h_errno);
	    }
	}
    }
    if (network_string == NULL) {
	static atom_t CM_NETWORK_POSTFIX = -1;
	if (CM_NETWORK_POSTFIX == -1) {
	    CM_NETWORK_POSTFIX = attr_atom_from_string(IPCONFIG_ENVVAR_PREFIX "NETWORK_POSTFIX");
	}
	if (!get_string_attr(attrs, CM_NETWORK_POSTFIX, &network_string)) {
	    trace_func(trace_data, "TCP/IP transport found no NETWORK POSTFIX attribute");
	} else {
	    trace_func(trace_data, "TCP/IP transport found NETWORK POSTFIX attribute %s", network_string);
	}
    }
    if (network_string != NULL) {
	size_t name_len = strlen(buf) + 2 + strlen(network_string);
	char *new_name_str = malloc(name_len);
	char *first_dot = strchr(buf, '.');

	/* stick the CM_NETWORK value in there */
	memset(new_name_str, 0, name_len);
	*first_dot = 0;
	first_dot++;
	sprintf(new_name_str, "%s%s.%s", buf, network_string, first_dot);
	if (gethostbyname(new_name_str) != NULL) {
	    /* host has no NETWORK interface */
	    strcpy(buf, new_name_str);
	    if (network_p) (*network_p)++;
	}
	free(new_name_str);
    }

    if ((buf[0] == 0) ||
	((host = gethostbyname(buf)) == NULL) ||
	(memchr(buf, '.', strlen(buf)) == NULL)) {
	/* just use the bloody IP address */
	struct in_addr IP;
	IP.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	if (IP.s_addr != 0) {
	    struct in_addr ip;
	    ip.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	    if (!inet_ntop(AF_INET, &(ip.s_addr), buf, len)) {
	        trace_func(trace_data, "inet_ntop failed\n");
	    }
	} else {
	    static int warn_once = 0;
	    if (warn_once == 0) {
		warn_once++;
		trace_func(trace_data, "Attempts to establish your fully qualified hostname, or indeed any\nuseful network name, have failed horribly.  using localhost.\n");
	    }
	    strncpy(buf, "localhost", len);
	}
    }
    trace_func(trace_data, "CM<IP_CONFIG> - GetQualHostname returning %s", buf);
}